

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# path-util.cc
# Opt level: O0

bool tinyusdz::pathutil::ResolveRelativePath
               (Path *base_prim_path,Path *relative_path,Path *abs_path,string *err)

{
  bool bVar1;
  int iVar2;
  string *psVar3;
  size_type sVar4;
  reference __rhs;
  Path local_388;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_298;
  allocator local_271;
  string local_270;
  allocator local_249;
  string local_248;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_228;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_208;
  size_type local_1e8;
  size_t i;
  ulong local_1c0;
  int64_t n;
  allocator local_191;
  string local_190;
  undefined1 local_170 [8];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  base_dirs;
  string local_150;
  undefined1 local_130 [8];
  string remainder;
  size_t ndepth;
  string local_100;
  allocator local_d9;
  string local_d8;
  undefined1 local_b8 [8];
  string abs_dir;
  string local_90;
  undefined1 local_70 [8];
  string base_str;
  string relative_str;
  string *err_local;
  Path *abs_path_local;
  Path *relative_path_local;
  Path *base_prim_path_local;
  
  if (abs_path == (Path *)0x0) {
    base_prim_path_local._7_1_ = 0;
    goto LAB_0017dc3e;
  }
  psVar3 = Path::prim_part_abi_cxx11_(relative_path);
  std::__cxx11::string::string((string *)(base_str.field_2._M_local_buf + 8),(string *)psVar3);
  psVar3 = Path::prim_part_abi_cxx11_(base_prim_path);
  std::__cxx11::string::string((string *)local_70,(string *)psVar3);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_90,"/",(allocator *)(abs_dir.field_2._M_local_buf + 0xf));
  bVar1 = startsWith((string *)local_70,&local_90);
  std::__cxx11::string::~string((string *)&local_90);
  std::allocator<char>::~allocator((allocator<char> *)(abs_dir.field_2._M_local_buf + 0xf));
  if (bVar1) {
    std::__cxx11::string::string((string *)local_b8);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_d8,"./",&local_d9);
    bVar1 = startsWith((string *)((long)&base_str.field_2 + 8),&local_d8);
    std::__cxx11::string::~string((string *)&local_d8);
    std::allocator<char>::~allocator((allocator<char> *)&local_d9);
    if (bVar1) {
      if (err != (string *)0x0) {
        std::__cxx11::string::operator+=((string *)err,"Path starting with `./` is not allowed.\n");
      }
      base_prim_path_local._7_1_ = 0;
      abs_dir.field_2._8_4_ = 1;
    }
    else {
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&local_100,"../",(allocator *)((long)&ndepth + 7));
      bVar1 = startsWith((string *)((long)&base_str.field_2 + 8),&local_100);
      std::__cxx11::string::~string((string *)&local_100);
      std::allocator<char>::~allocator((allocator<char> *)((long)&ndepth + 7));
      if (bVar1) {
        remainder.field_2._8_8_ = 0;
        anon_unknown_2::RemoveRelativePrefix
                  ((string *)local_130,(string *)((long)&base_str.field_2 + 8),
                   (size_t *)(remainder.field_2._M_local_buf + 8));
        std::allocator<char>::allocator();
        std::__cxx11::string::string
                  ((string *)&local_150,".",
                   (allocator *)
                   ((long)&base_dirs.
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
        bVar1 = contains_str((string *)local_130,&local_150);
        std::__cxx11::string::~string((string *)&local_150);
        std::allocator<char>::~allocator
                  ((allocator<char> *)
                   ((long)&base_dirs.
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
        if (bVar1) {
          if (err != (string *)0x0) {
            std::__cxx11::string::operator+=
                      ((string *)err,"`../` in the middle of Path is not allowed.\n");
          }
          base_prim_path_local._7_1_ = 0;
          abs_dir.field_2._8_4_ = 1;
        }
        else {
          std::allocator<char>::allocator();
          std::__cxx11::string::string((string *)&local_190,"/",&local_191);
          iVar2 = std::numeric_limits<int>::max();
          split((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)local_170,(string *)local_70,&local_190,iVar2 / 100);
          std::__cxx11::string::~string((string *)&local_190);
          std::allocator<char>::~allocator((allocator<char> *)&local_191);
          sVar4 = std::
                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          *)local_170);
          if (sVar4 == 0) {
            std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&n,
                           "/",(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               local_130);
            std::__cxx11::string::operator=((string *)local_b8,(string *)&n);
            std::__cxx11::string::~string((string *)&n);
LAB_0017da45:
            abs_dir.field_2._8_4_ = 0;
          }
          else {
            sVar4 = std::
                    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            *)local_170);
            local_1c0 = sVar4 - remainder.field_2._8_8_;
            if (-2 < (long)local_1c0) {
              if ((long)local_1c0 < 1) {
                std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               &i,"/",(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                       *)local_130);
                std::__cxx11::string::operator+=((string *)local_b8,(string *)&i);
                std::__cxx11::string::~string((string *)&i);
              }
              else {
                for (local_1e8 = 0; local_1e8 < local_1c0; local_1e8 = local_1e8 + 1) {
                  __rhs = std::
                          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                        *)local_170,local_1e8);
                  std::operator+(&local_208,"/",__rhs);
                  std::__cxx11::string::operator+=((string *)local_b8,(string *)&local_208);
                  std::__cxx11::string::~string((string *)&local_208);
                }
                std::operator+(&local_228,"/",
                               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               local_130);
                std::__cxx11::string::operator+=((string *)local_b8,(string *)&local_228);
                std::__cxx11::string::~string((string *)&local_228);
              }
              goto LAB_0017da45;
            }
            if (err != (string *)0x0) {
              std::__cxx11::string::operator+=
                        ((string *)err,"The number of `../` exceeds Prim path depth.\n");
            }
            base_prim_path_local._7_1_ = 0;
            abs_dir.field_2._8_4_ = 1;
          }
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)local_170);
        }
        std::__cxx11::string::~string((string *)local_130);
        if (abs_dir.field_2._8_4_ != 0) goto LAB_0017dc20;
      }
      else {
        std::allocator<char>::allocator();
        std::__cxx11::string::string((string *)&local_248,".",&local_249);
        bVar1 = startsWith((string *)((long)&base_str.field_2 + 8),&local_248);
        std::__cxx11::string::~string((string *)&local_248);
        std::allocator<char>::~allocator((allocator<char> *)&local_249);
        if (bVar1) {
          if (err != (string *)0x0) {
            std::__cxx11::string::operator+=
                      ((string *)err,"A path starting with `.` is not allowed for Prim path.\n");
          }
          base_prim_path_local._7_1_ = 0;
          abs_dir.field_2._8_4_ = 1;
          goto LAB_0017dc20;
        }
        std::allocator<char>::allocator();
        std::__cxx11::string::string((string *)&local_270,"/",&local_271);
        bVar1 = startsWith((string *)((long)&base_str.field_2 + 8),&local_270);
        std::__cxx11::string::~string((string *)&local_270);
        std::allocator<char>::~allocator((allocator<char> *)&local_271);
        if (bVar1) {
          std::__cxx11::string::operator=
                    ((string *)local_b8,(string *)(base_str.field_2._M_local_buf + 8));
        }
        else {
          std::operator+(&local_2b8,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_70,"/");
          std::operator+(&local_298,&local_2b8,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         ((long)&base_str.field_2 + 8));
          std::__cxx11::string::operator=((string *)local_b8,(string *)&local_298);
          std::__cxx11::string::~string((string *)&local_298);
          std::__cxx11::string::~string((string *)&local_2b8);
        }
      }
      psVar3 = Path::prop_part_abi_cxx11_(relative_path);
      Path::Path(&local_388,(string *)local_b8,psVar3);
      Path::operator=(abs_path,&local_388);
      Path::~Path(&local_388);
      base_prim_path_local._7_1_ = 1;
      abs_dir.field_2._8_4_ = 1;
    }
LAB_0017dc20:
    std::__cxx11::string::~string((string *)local_b8);
  }
  else {
    if (err != (string *)0x0) {
      std::__cxx11::string::operator+=((string *)err,"Base Prim path is not absolute path.\n");
    }
    base_prim_path_local._7_1_ = 0;
    abs_dir.field_2._8_4_ = 1;
  }
  std::__cxx11::string::~string((string *)local_70);
  std::__cxx11::string::~string((string *)(base_str.field_2._M_local_buf + 8));
LAB_0017dc3e:
  return (bool)(base_prim_path_local._7_1_ & 1);
}

Assistant:

bool ResolveRelativePath(const Path &base_prim_path, const Path &relative_path, Path *abs_path, std::string *err) {

  if (!abs_path) {
    return false;
  }

  std::string relative_str = relative_path.prim_part();
  std::string base_str = base_prim_path.prim_part();

  // base_prim_path must be absolute.
  if (startsWith(base_str, "/")) {
    // ok
  } else {
    if (err) {
      (*err) += "Base Prim path is not absolute path.\n";
    }
    return false;
  }

  std::string abs_dir;

  if (startsWith(relative_str, "./")) {
    // pxrUSD doesn't allow "./", so do same in tinyusdz.
#if 1
    if (err) {
      (*err) += "Path starting with `./` is not allowed.\n";
    }
    return false;
#else
    std::string remainder = removePrefix(relative_str, "./");

    // "./../", "././", etc is not allowed at the moment.
    if (contains_str(remainder, ".")) {
      return false;
    }

    abs_dir = base_str + "/" + remainder;
#endif

  } else if (startsWith(relative_str, "../")) {
    // ok
    size_t ndepth{0};
    std::string remainder = RemoveRelativePrefix(relative_str, ndepth);
    DCOUT("remainder = " << remainder << ", ndepth = " << ndepth);

    // "../" in subsequent position(e.g. `../bora/../dora`) is not allowed at the moment.
    if (contains_str(remainder, ".")) {
      if (err) {
        (*err) += "`../` in the middle of Path is not allowed.\n";
      }
      return false;
    }

    std::vector<std::string> base_dirs = split(base_str, "/");
    DCOUT("base_dirs.len = " << base_dirs.size());
    //if (base_dirs.size() < ndepth) {
    //  return false;
    //}

    if (base_dirs.size() == 0) { // "/"
      abs_dir = "/" + remainder;
    } else {
      int64_t n = int64_t(base_dirs.size()) - int64_t(ndepth);

#if 1
      // pxrUSD behavior
      if (n < -1) {
        if (err) {
          (*err) += "The number of `../` exceeds Prim path depth.\n";
        }
        return false;
      }
#else
      // Unixish path behavior
#endif
      if (n <= 0) {
        abs_dir += "/" + remainder;
      } else {
        for (size_t i = 0; i < size_t(n); i++) {
          abs_dir += "/" + base_dirs[i];
        }
        abs_dir += "/" + remainder;
      }
    }
  } else if (startsWith(relative_str, ".")) {
    // Property path?
    if (err) {
      (*err) += "A path starting with `.` is not allowed for Prim path.\n";
    }
    return false;
  } else if (startsWith(relative_str, "/")) {
    // Input path is already absolute.
    abs_dir = relative_str;
  } else {
    // Guess relative path(e.g. "muda", "bora/dora")
    // TODO: Check Path contains valid characters.
    abs_dir = base_str + "/" + relative_str;
  }

  (*abs_path) = Path(abs_dir, relative_path.prop_part());

  return true;
}